

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O1

REF_STATUS ref_inflate_extend_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  REF_DBL *pRVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  uVar8 = *n;
  if (1 < (int)uVar8) {
    uVar12 = (ulong)(uVar8 - 1);
    dVar16 = x[uVar12];
    dVar15 = *x;
    dVar17 = x[1];
    dVar1 = yz[2];
    dVar2 = *yz;
    dVar3 = yz[1];
    dVar4 = yz[3];
    dVar5 = *phi;
    dVar6 = phi[1];
    pRVar13 = yz + uVar12 * 2 + 3;
    lVar10 = uVar12 + 1;
    do {
      x[lVar10] = x[lVar10 + -1];
      pRVar13[-1] = pRVar13[-3];
      *pRVar13 = pRVar13[-2];
      pRVar13 = pRVar13 + -2;
      phi[lVar10] = phi[lVar10 + -1];
      lVar11 = lVar10 + -1;
      bVar7 = 0 < lVar10;
      lVar10 = lVar11;
    } while (lVar11 != 0 && bVar7);
    dVar14 = (dVar16 - dVar15) * 0.25;
    iVar9 = uVar8 + 1;
    *n = iVar9;
    *x = x[1] - dVar14;
    dVar16 = dVar14 / (dVar17 - dVar15);
    *yz = yz[2] - (dVar1 - dVar2) * dVar16;
    yz[1] = yz[3] - (dVar4 - dVar3) * dVar16;
    *phi = phi[1] - dVar16 * (dVar6 - dVar5);
    dVar15 = x[uVar8] - x[(ulong)uVar8 - 1];
    dVar16 = dVar15 * 1e+20;
    if (dVar16 <= -dVar16) {
      dVar16 = -dVar16;
    }
    dVar17 = dVar14;
    if (dVar14 <= -dVar14) {
      dVar17 = -dVar14;
    }
    if (dVar17 < dVar16) {
      x[(ulong)uVar8 + 1] = x[uVar8] + dVar14;
      dVar14 = dVar14 / dVar15;
      yz[iVar9 * 2] = (yz[iVar9 * 2 + -2] - yz[iVar9 * 2 + -4]) * dVar14 + yz[iVar9 * 2 + -2];
      yz[iVar9 * 2 + 1] = (yz[iVar9 * 2 + -1] - yz[iVar9 * 2 + -3]) * dVar14 + yz[iVar9 * 2 + -1];
      phi[(ulong)uVar8 + 1] = (phi[uVar8] - phi[(ulong)uVar8 - 1]) * dVar14 + phi[uVar8];
      uVar8 = uVar8 + 2;
      *n = uVar8;
    }
  }
  return uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_extend_rail(REF_INT *n, REF_DBL *x,
                                                  REF_DBL *yz, REF_DBL *phi) {
  REF_DBL dx, l, dy, dz, dp;
  REF_INT i;
  if (2 > *n) return REF_SUCCESS;

  l = x[(*n) - 1] - x[0];
  l = 0.25 * l;

  dx = x[1] - x[0];
  dy = yz[0 + 2 * 1] - yz[0 + 2 * 0];
  dz = yz[1 + 2 * 1] - yz[1 + 2 * 0];
  dp = phi[1] - phi[0];

  /* shift to add first node */
  for (i = (*n) - 1; i >= 0; i--) {
    x[i + 1] = x[i];
    yz[0 + 2 * (i + 1)] = yz[0 + 2 * (i)];
    yz[1 + 2 * (i + 1)] = yz[1 + 2 * (i)];
    phi[(i + 1)] = phi[(i)];
  }
  (*n)++;

  x[0] = x[1] - l;
  yz[0 + 2 * 0] = yz[0 + 2 * 1] - dy * (l / dx);
  yz[1 + 2 * 0] = yz[1 + 2 * 1] - dz * (l / dx);
  phi[0] = phi[1] - dp * (l / dx);

  dx = x[(*n) - 1] - x[(*n) - 2];
  if (ref_math_divisible(l, dx)) {
    x[(*n)] = x[(*n) - 1] + l;

    dy = yz[0 + 2 * ((*n) - 1)] - yz[0 + 2 * ((*n) - 2)];
    yz[0 + 2 * (*n)] = yz[0 + 2 * ((*n) - 1)] + dy * (l / dx);

    dz = yz[1 + 2 * ((*n) - 1)] - yz[1 + 2 * ((*n) - 2)];
    yz[1 + 2 * (*n)] = yz[1 + 2 * ((*n) - 1)] + dz * (l / dx);

    dp = phi[((*n) - 1)] - phi[((*n) - 2)];
    phi[(*n)] = phi[((*n) - 1)] + dp * (l / dx);

    (*n)++;
  }
  return REF_SUCCESS;
}